

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bitwidth_t __thiscall slang::ast::Type::getBitWidth(Type *this)

{
  bool bVar1;
  SymbolKind SVar2;
  Type *this_00;
  ulong uVar3;
  
  this_00 = getCanonicalType(this);
  bVar1 = isIntegral(this_00);
  if (bVar1) {
    SVar2 = this_00[1].super_Symbol.kind;
  }
  else {
    bVar1 = isFloating(this_00);
    SVar2 = Unknown;
    if ((bVar1) && (uVar3 = (ulong)this_00[1].super_Symbol.kind, uVar3 < 3)) {
      SVar2 = *(SymbolKind *)(&DAT_0044db18 + uVar3 * 4);
    }
  }
  return SVar2;
}

Assistant:

bitwidth_t Type::getBitWidth() const {
    const Type& ct = getCanonicalType();
    if (ct.isIntegral())
        return ct.as<IntegralType>().bitWidth;

    if (ct.isFloating()) {
        switch (ct.as<FloatingType>().floatKind) {
            case FloatingType::Real:
                return 64;
            case FloatingType::RealTime:
                return 64;
            case FloatingType::ShortReal:
                return 32;
        }
    }
    return 0;
}